

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O3

vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_> *
__thiscall
wavingz::encoder<signed_char>::operator()
          (vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
           *__return_storage_ptr__,encoder<signed_char> *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          payload_begin,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          payload_end,double silence)

{
  pointer *pppVar1;
  iterator iVar2;
  ulong uVar3;
  ulong uVar4;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> ch
  ;
  long lVar5;
  double dVar6;
  size_t sample;
  pair<signed_char,_signed_char> local_64;
  pair<signed_char,_signed_char> local_62;
  double local_60;
  double local_58;
  double local_50;
  uchar *local_48;
  size_t local_40;
  iir_filter<6> *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = silence;
  local_48 = payload_end._M_current;
  if (999 < this->sample_rate) {
    local_38 = &this->lp1;
    uVar4 = 0;
    do {
      local_60 = iir_filter<6>::operator()(local_38,0.0);
      local_58 = iir_filter<6>::operator()(&this->lp2,0.0);
      complex8_convert<signed_char>::check_range(&this->convert_iq,local_60,local_58);
      dVar6 = (this->convert_iq).A_m;
      local_62 = (pair<signed_char,_signed_char>)
                 ((ushort)(int)(local_60 * dVar6) & 0xff | (ushort)((int)(local_58 * dVar6) << 8));
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<signed_char,signed_char>,std::allocator<std::pair<signed_char,signed_char>>>
        ::_M_realloc_insert<std::pair<signed_char,signed_char>>
                  ((vector<std::pair<signed_char,signed_char>,std::allocator<std::pair<signed_char,signed_char>>>
                    *)__return_storage_ptr__,iVar2,&local_62);
      }
      else {
        *iVar2._M_current = local_62;
        pppVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != this->sample_rate / 1000);
  }
  local_40 = 0;
  lVar5 = 0x14;
  do {
    emplace_byte(this,'U',&local_40,__return_storage_ptr__);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  emplace_byte(this,-0x10,&local_40,__return_storage_ptr__);
  if (payload_begin._M_current != local_48) {
    do {
      emplace_byte(this,*payload_begin._M_current,&local_40,__return_storage_ptr__);
      payload_begin._M_current = payload_begin._M_current + 1;
    } while (payload_begin._M_current != local_48);
  }
  dVar6 = (((double)CONCAT44(0x45300000,(int)(this->sample_rate >> 0x20)) - 1.9342813113834067e+25)
          + ((double)CONCAT44(0x43300000,(int)this->sample_rate) - 4503599627370496.0)) * local_50;
  lVar5 = (long)dVar6;
  if (((long)(dVar6 - 9.223372036854776e+18) & lVar5 >> 0x3f) != 0 || lVar5 != 0) {
    uVar4 = 0;
    do {
      local_60 = iir_filter<6>::operator()(&this->lp1,0.0);
      local_58 = iir_filter<6>::operator()(&this->lp2,0.0);
      complex8_convert<signed_char>::check_range(&this->convert_iq,local_60,local_58);
      dVar6 = (this->convert_iq).A_m;
      local_64 = (pair<signed_char,_signed_char>)
                 ((ushort)(int)(local_60 * dVar6) & 0xff | (ushort)((int)(local_58 * dVar6) << 8));
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<signed_char,signed_char>,std::allocator<std::pair<signed_char,signed_char>>>
        ::_M_realloc_insert<std::pair<signed_char,signed_char>>
                  ((vector<std::pair<signed_char,signed_char>,std::allocator<std::pair<signed_char,signed_char>>>
                    *)__return_storage_ptr__,iVar2,&local_64);
      }
      else {
        *iVar2._M_current = local_64;
        pppVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      uVar4 = uVar4 + 1;
      dVar6 = (((double)CONCAT44(0x45300000,(int)(this->sample_rate >> 0x20)) -
               1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)this->sample_rate) - 4503599627370496.0)) * local_50
      ;
      uVar3 = (ulong)dVar6;
    } while (uVar4 != ((long)(dVar6 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<Byte, Byte>>
    operator()(It payload_begin, It payload_end, double silence = 1.0)
    {
        constexpr uint8_t PREAMBLE = 0x55; // 10101010...10101010 frame preamble
        constexpr uint8_t SOF = 0xF0;      // Start of frame mark

        std::vector<std::pair<Byte, Byte>> iq;

        // .001" silence
        for (size_t ii(0); ii != sample_rate / 1000; ++ii) {
            iq.emplace_back(convert_iq(lp1(0.0), lp2(0.0)));
        }

        size_t sample = 0;

        // preamble
        for (size_t ii(0); ii != 20; ++ii) {
            emplace_byte(PREAMBLE, sample, iq);
        }

        // SOF
        emplace_byte(SOF, sample, iq);

        // payload
        for (It ch = payload_begin; ch != payload_end; ++ch) {
            emplace_byte(*ch, sample, iq);
        }

        // silence at the end (it seems that more or less 1" is needed by the HackRF
        // One to complete transmission?)
        for (size_t ii(0); ii != size_t(silence*sample_rate); ++ii) {
            iq.emplace_back(convert_iq(lp1(0.0), lp2(0.0)));
        }
        return iq;
    }